

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_regions.hpp
# Opt level: O1

event_set * __thiscall
afsm::orthogonal::
regions_table<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::ortho_sm_def::on,_unsigned_long>
::current_handled_events
          (event_set *__return_storage_ptr__,
          regions_table<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::ortho_sm_def::on,_unsigned_long>
          *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  detail::invoke_nth<1ul>::
  collect_events<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
            (&this->regions_,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

event_set
    current_handled_events() const
    {
        event_set evts;
        all_regions::collect_events(regions_, evts);
        return evts;
    }